

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

FDoomEdEntry * __thiscall
TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Insert
          (TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_> *this,int key,
          FDoomEdEntry *value)

{
  PClassActor *pPVar1;
  undefined8 uVar2;
  short sVar3;
  char cVar4;
  undefined1 uVar5;
  int iVar6;
  Node *pNVar7;
  
  pNVar7 = FindKey(this,key);
  if (pNVar7 == (Node *)0x0) {
    pNVar7 = NewKey(this,key);
  }
  pPVar1 = value->Type;
  sVar3 = value->Special;
  cVar4 = value->ArgsDefined;
  uVar5 = value->field_0xb;
  iVar6 = value->Args[0];
  uVar2 = *(undefined8 *)(value->Args + 3);
  *(undefined8 *)((pNVar7->Pair).Value.Args + 1) = *(undefined8 *)(value->Args + 1);
  *(undefined8 *)((pNVar7->Pair).Value.Args + 3) = uVar2;
  (pNVar7->Pair).Value.Type = pPVar1;
  (pNVar7->Pair).Value.Special = sVar3;
  (pNVar7->Pair).Value.ArgsDefined = cVar4;
  (pNVar7->Pair).Value.field_0xb = uVar5;
  (pNVar7->Pair).Value.Args[0] = iVar6;
  return &(pNVar7->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}